

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall cfd::core::BlindFactor::BlindFactor(BlindFactor *this,ByteData *byte_data)

{
  ByteData256 local_30;
  ByteData *local_18;
  ByteData *byte_data_local;
  BlindFactor *this_local;
  
  local_18 = byte_data;
  byte_data_local = (ByteData *)this;
  ByteData256::ByteData256(&local_30,byte_data);
  BlindFactor(this,&local_30);
  ByteData256::~ByteData256((ByteData256 *)0x4a35e1);
  return;
}

Assistant:

BlindFactor::BlindFactor(const ByteData &byte_data)
    : BlindFactor(ByteData256(byte_data)) {
  // do nothing
}